

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::bean_ptr<B>::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (bean_ptr<B> *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  sqlid_t *psVar1;
  int *piVar2;
  shared_cnt_obj_pair<hiberlite::real_bean<B>_> *psVar3;
  real_bean<B> *prVar4;
  logic_error *this_00;
  bool bVar5;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar6;
  sqlid_t sVar7;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *unaff_R15;
  bean_key local_e8;
  bean_ptr<B> local_d0;
  string local_b8;
  string local_98;
  sql_nvp<long_long> local_78;
  
  psVar3 = (this->super_shared_res<hiberlite::real_bean<B>_>).res;
  sVar7 = -1;
  psVar6 = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)this;
  if ((psVar3 != (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) &&
     (prVar4 = psVar3->res, prVar4 != (real_bean<B> *)0x0)) {
    sVar7 = (prVar4->key).id;
    psVar6 = (prVar4->key).con.res;
    if ((psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) &&
       ((int)*(sqlid_t *)&psVar6->refCount == 0)) {
      (*((shared_res<hiberlite::real_bean<B>_> *)&psVar6->_vptr_shared_cnt_obj_pair)->
        _vptr_shared_res[1])();
    }
  }
  this->tmp_id = sVar7;
  if (sVar7 == -1) {
    bVar5 = false;
  }
  else {
    unaff_R15 = (ar->rootKey).con.res;
    if (unaff_R15 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      unaff_R15->refCount = unaff_R15->refCount + 1;
    }
    psVar6 = (((this->super_shared_res<hiberlite::real_bean<B>_>).res)->res->key).con.res;
    if (psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar6->refCount = (int)*(sqlid_t *)&psVar6->refCount + 1;
    }
    bVar5 = (psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) !=
            (unaff_R15 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0);
  }
  if (sVar7 != -1) {
    if (psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar1 = (sqlid_t *)&psVar6->refCount;
      *(int *)psVar1 = (int)*psVar1 + -1;
      if ((int)*psVar1 == 0) {
        (*((shared_res<hiberlite::real_bean<B>_> *)&psVar6->_vptr_shared_cnt_obj_pair)->
          _vptr_shared_res[1])();
      }
    }
    if (unaff_R15 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar2 = &unaff_R15->refCount;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (*unaff_R15->_vptr_shared_cnt_obj_pair[1])(unaff_R15);
      }
    }
  }
  if (!bVar5) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"id","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    sql_nvp<long_long>::sql_nvp(&local_78,&local_98,&this->tmp_id,&local_b8);
    AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.search_key._M_dataplus._M_p != &local_78.search_key.field_2) {
      operator_delete(local_78.search_key._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
      operator_delete(local_78.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (ar->purpose == 1) {
      psVar6 = (ar->rootKey).con.res;
      if (psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        psVar6->refCount = psVar6->refCount + 1;
      }
      local_e8.id = this->tmp_id;
      local_e8.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
      if (psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        psVar6->refCount = psVar6->refCount + 1;
      }
      local_e8.con.res = psVar6;
      Registry<B>::get(&local_d0,&local_e8);
      operator=(this,&local_d0);
      local_d0.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
           (_func_int **)&PTR__shared_res_001d4488;
      if (local_d0.super_shared_res<hiberlite::real_bean<B>_>.res !=
          (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) {
        piVar2 = &(local_d0.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          (*(local_d0.super_shared_res<hiberlite::real_bean<B>_>.res)->_vptr_shared_cnt_obj_pair[1])
                    ();
        }
      }
      local_e8.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
      if (local_e8.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar2 = &(local_e8.con.res)->refCount;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          (*(local_e8.con.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      if (psVar6 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar2 = &psVar6->refCount;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          (*psVar6->_vptr_shared_cnt_obj_pair[1])(psVar6);
        }
      }
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"saving the bean from different database");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void bean_ptr<C>::hibernate(Archive & ar)
{
	tmp_id=get_id();

	if(tmp_id!=Database::NULL_ID
			&& ar.getConnection()!=shared_res< real_bean<C> >::get_object()->get_key().con)
		throw std::logic_error("saving the bean from different database");

	ar & hiberlite::sql_nvp< sqlid_t > ("id", tmp_id );
	if(ar.is_loading())
		*this=Registry<C>::get( bean_key(ar.getConnection(), tmp_id) );
}